

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_remove(REF_CELL ref_cell,REF_INT cell)

{
  uint uVar1;
  int local_20;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT cell_local;
  REF_CELL ref_cell_local;
  
  if (((cell < 0) || (ref_cell->max <= cell)) || (ref_cell->c2n[ref_cell->size_per * cell] == -1)) {
    ref_cell_local._4_4_ = 3;
  }
  else {
    ref_cell->n = ref_cell->n + -1;
    for (local_20 = 0; local_20 < ref_cell->node_per; local_20 = local_20 + 1) {
      uVar1 = ref_adj_remove(ref_cell->ref_adj,ref_cell->c2n[local_20 + ref_cell->size_per * cell],
                             cell);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x315,"ref_cell_remove",(ulong)uVar1,"unregister cell");
        return uVar1;
      }
    }
    ref_cell->c2n[ref_cell->size_per * cell] = -1;
    ref_cell->c2n[ref_cell->size_per * cell + 1] = ref_cell->blank;
    ref_cell->blank = cell;
    ref_cell_local._4_4_ = 0;
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_remove(REF_CELL ref_cell, REF_INT cell) {
  REF_INT node;
  if (!ref_cell_valid(ref_cell, cell)) return REF_INVALID;
  ref_cell_n(ref_cell)--;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    RSS(ref_adj_remove(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                       cell),
        "unregister cell");

  ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
  ref_cell_c2n(ref_cell, 1, cell) = ref_cell_blank(ref_cell);
  ref_cell_blank(ref_cell) = cell;

  return REF_SUCCESS;
}